

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O1

void array_list_free(array_list *arr)

{
  ulong uVar1;
  
  if (arr->length != 0) {
    uVar1 = 0;
    do {
      if (arr->array[uVar1] != (void *)0x0) {
        (*arr->free_fn)(arr->array[uVar1]);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < arr->length);
  }
  free(arr->array);
  free(arr);
  return;
}

Assistant:

extern void array_list_free(struct array_list *arr)
{
	size_t i;
	for (i = 0; i < arr->length; i++)
		if (arr->array[i])
			arr->free_fn(arr->array[i]);
	free(arr->array);
	free(arr);
}